

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handles<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  VkPipelineShaderStageCreateInfo *stage;
  uint32_t i;
  VkGraphicsPipelineCreateInfo *info_local;
  Impl *this_local;
  
  stage._4_4_ = 0;
  while( true ) {
    if (info->stageCount <= stage._4_4_) {
      return true;
    }
    bVar1 = remap_shader_module_handle(this,info->pStages + stage._4_4_);
    if (!bVar1) break;
    stage._4_4_ = stage._4_4_ + 1;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handles(CreateInfo *info)
{
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);
		if (!remap_shader_module_handle(stage))
			return false;
	}

	return true;
}